

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nwkMerge.c
# Opt level: O0

Nwk_Vrt_t * Nwk_ManGraphListFindMin(Nwk_Grf_t *p,int List)

{
  Nwk_Vrt_t *local_48;
  Nwk_Vrt_t *local_40;
  int local_34;
  int local_30;
  int BestCost;
  int Counter;
  int k;
  Nwk_Vrt_t *pMinCost;
  Nwk_Vrt_t *pThis;
  int List_local;
  Nwk_Grf_t *p_local;
  
  _Counter = (Nwk_Vrt_t *)0x0;
  local_30 = 10000;
  local_34 = 1000000;
  if (List == 0) {
    local_40 = (Nwk_Vrt_t *)0x0;
  }
  else {
    local_40 = p->pVerts[List];
  }
  pMinCost = local_40;
  while( true ) {
    if (pMinCost == (Nwk_Vrt_t *)0x0) {
      return _Counter;
    }
    for (BestCost = 0; BestCost < pMinCost->nEdges; BestCost = BestCost + 1) {
      if ((_Counter == (Nwk_Vrt_t *)0x0) ||
         (p->pVerts[(&pMinCost[1].Id)[BestCost]]->nEdges < local_34)) {
        local_34 = p->pVerts[(&pMinCost[1].Id)[BestCost]]->nEdges;
        _Counter = pMinCost;
      }
    }
    local_30 = local_30 + -1;
    if (local_30 == 0) break;
    if (pMinCost->iNext == 0) {
      local_48 = (Nwk_Vrt_t *)0x0;
    }
    else {
      local_48 = p->pVerts[pMinCost->iNext];
    }
    pMinCost = local_48;
  }
  return _Counter;
}

Assistant:

Nwk_Vrt_t * Nwk_ManGraphListFindMin( Nwk_Grf_t * p, int List )
{
    Nwk_Vrt_t * pThis, * pMinCost = NULL;
    int k, Counter = 10000, BestCost = 1000000;
    Nwk_ListForEachVertex( p, List, pThis )
    {
        for ( k = 0; k < pThis->nEdges; k++ )
        {
            if ( pMinCost == NULL || BestCost > p->pVerts[pThis->pEdges[k]]->nEdges )
            {
                BestCost = p->pVerts[pThis->pEdges[k]]->nEdges;
                pMinCost = pThis;
            }
        }
        if ( --Counter == 0 )
            break;
    }
    return pMinCost;
}